

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::GetGrevilleAbcissae(ON_NurbsSurface *this,int dir,double *g)

{
  bool bVar1;
  double *g_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  g_local._4_4_ = dir;
  if (dir != 0) {
    g_local._4_4_ = 1;
  }
  bVar1 = ON_GetGrevilleAbcissae
                    (this->m_order[g_local._4_4_],this->m_cv_count[g_local._4_4_],
                     this->m_knot[g_local._4_4_],false,g);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::GetGrevilleAbcissae(
         int dir,
         double* g
         ) const
{
  if (dir) 
    dir = 1;
  // The "false" for the 4th parameter is on purpose and should not be
  // replaced with this->IsPeriodic(dir).  The problem
  // being that when the 4th parameter is true, it is not possible
  // to determine which subset of the full list of Greville abcissae
  // was returned.
  return ON_GetGrevilleAbcissae( m_order[dir], m_cv_count[dir], m_knot[dir], false, g );
}